

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Nullable<const_char_*> pcVar3;
  LogMessage local_20;
  
  pcVar3 = absl::lts_20250127::log_internal::Check_LEImpl
                     (count,this->last_returned_size_,"count <= last_returned_size_");
  if (pcVar3 != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x76,pcVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,(char (*) [58])"BackUp() can not exceed the size of the last Next() call.")
    ;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  pcVar3 = absl::lts_20250127::log_internal::Check_GEImpl(count,0,"count >= 0");
  if (pcVar3 == (Nullable<const_char_*>)0x0) {
    uVar1 = this->position_;
    uVar2 = this->last_returned_size_;
    this->position_ = uVar1 - count;
    this->last_returned_size_ = uVar2 - count;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x78,pcVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  ABSL_CHECK_LE(count, last_returned_size_)
      << "BackUp() can not exceed the size of the last Next() call.";
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ -= count;
}